

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O2

void set_multi_layer_params_for_fp
               (TWO_PASS *twopass,TWO_PASS_FRAME *twopass_frame,GF_GROUP *gf_group,
               PRIMARY_RATE_CONTROL *p_rc,RATE_CONTROL *rc,FRAME_INFO *frame_info,int start,int end,
               int *cur_frame_idx,int *frame_ind,int *parallel_frame_count,int max_parallel_frames,
               int do_frame_parallel_encode,int *first_frame_index,int depth_thr,int *cur_disp_idx,
               int layer_depth)

{
  ulong uVar1;
  int *cur_disp_index;
  int iVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  int iVar10;
  int *piVar11;
  undefined4 in_stack_00000014;
  undefined4 in_stack_0000003c;
  undefined4 in_stack_0000004c;
  int local_88 [4];
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68 [8];
  uint local_48 [4];
  ulong local_38;
  
  piVar9 = (int *)((ulong)cur_disp_idx & 0xffffffff);
  piVar5 = (int *)CONCAT44(in_stack_0000004c,depth_thr);
  while( true ) {
    uVar7 = (uint)frame_info;
    iVar10 = start - uVar7;
    if ((gf_group->max_layer_depth_allowed < (int)piVar9) || (iVar10 < 3)) break;
    uVar1 = (long)(int)(start + -1 + uVar7) / 2;
    iVar10 = (int)uVar1;
    set_params_for_internal_arfs
              (twopass,twopass_frame,p_rc,(FRAME_INFO *)rc,gf_group,
               (int *)CONCAT44(in_stack_00000014,end),cur_frame_idx,frame_ind,
               (int)parallel_frame_count,max_parallel_frames,
               (int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode),0x7fffffff,piVar5,
               (int)piVar9,iVar10 - uVar7,iVar10,start - iVar10,iVar10 - uVar7);
    uVar6 = iVar10 + 1;
    iVar3 = (int)piVar9;
    if ((int)first_frame_index <= iVar3) {
      iVar8 = (int)(iVar10 + uVar7 + -1) / 2;
      iVar2 = (int)(start + uVar6) / 2;
      local_70 = iVar8 - uVar7;
      local_6c = iVar2 - uVar7;
      local_78 = iVar8;
      local_74 = iVar2;
      local_38 = uVar1 & 0xffffffff;
      local_88[2] = iVar10 - iVar8;
      local_88[3] = start - iVar2;
      local_88[0] = iVar8 - uVar7;
      local_88[1] = iVar2 - uVar6;
      iVar3 = iVar3 + 1;
      piVar5 = (int *)CONCAT44(in_stack_0000004c,depth_thr);
      for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
        set_params_for_internal_arfs
                  (twopass,twopass_frame,p_rc,(FRAME_INFO *)rc,gf_group,
                   (int *)CONCAT44(in_stack_00000014,end),cur_frame_idx,frame_ind,
                   (int)parallel_frame_count,max_parallel_frames,
                   (int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode),
                   (int)first_frame_index,piVar5,iVar3,local_88[lVar4 + 6],local_88[lVar4 + 4],
                   local_88[lVar4 + 2],local_88[lVar4]);
      }
      local_48[0] = uVar7;
      local_48[1] = iVar8 + 1;
      local_48[2] = uVar6;
      local_48[3] = start + -1;
      local_68[4] = iVar8;
      local_68[5] = (int)local_38;
      local_68[0] = iVar3;
      local_68[1] = (int)piVar9;
      local_68[2] = iVar3;
      local_68[3] = 0xffffffff;
      local_68[6] = iVar2;
      local_68[7] = start;
      piVar5 = (int *)(ulong)((int)piVar9 + 2);
      for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
        cur_disp_index = (int *)CONCAT44(in_stack_0000004c,depth_thr);
        piVar11 = (int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode);
        piVar9 = (int *)CONCAT44(in_stack_00000014,end);
        set_multi_layer_params_for_fp
                  (twopass,twopass_frame,gf_group,p_rc,rc,(FRAME_INFO *)(ulong)local_48[lVar4],
                   local_88[lVar4 + 0xc],end,cur_frame_idx,frame_ind,
                   (int *)((ulong)parallel_frame_count & 0xffffffff),max_parallel_frames,
                   do_frame_parallel_encode,(int *)((ulong)first_frame_index & 0xffffffff),depth_thr
                   ,piVar5,(int)piVar5);
        if (local_88[lVar4 + 8] != -1) {
          set_params_for_intnl_overlay_frames
                    (gf_group,piVar9,cur_frame_idx,piVar11,cur_disp_index,local_88[lVar4 + 8]);
        }
      }
      return;
    }
    piVar9 = (int *)(ulong)(iVar3 + 1);
    piVar5 = (int *)CONCAT44(in_stack_0000004c,depth_thr);
    piVar11 = (int *)CONCAT44(in_stack_00000014,end);
    set_multi_layer_params_for_fp
              (twopass,twopass_frame,gf_group,p_rc,rc,(FRAME_INFO *)((ulong)frame_info & 0xffffffff)
               ,iVar10,end,cur_frame_idx,frame_ind,(int *)((ulong)parallel_frame_count & 0xffffffff)
               ,max_parallel_frames,do_frame_parallel_encode,
               (int *)((ulong)first_frame_index & 0xffffffff),depth_thr,piVar9,iVar3);
    set_params_for_intnl_overlay_frames
              (gf_group,piVar11,cur_frame_idx,
               (int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode),piVar5,iVar3);
    frame_info = (FRAME_INFO *)(ulong)uVar6;
  }
  piVar11 = (int *)CONCAT44(in_stack_00000014,end);
  while (iVar3 = (int)frame_info, iVar3 < start) {
    gf_group->update_type[*cur_frame_idx] = '\x01';
    gf_group->arf_src_offset[*cur_frame_idx] = '\0';
    gf_group->cur_frame_idx[*cur_frame_idx] = (uchar)*piVar11;
    gf_group->layer_depth[*cur_frame_idx] = 6;
    gf_group->frame_type[*cur_frame_idx] = '\x01';
    gf_group->refbuf_state[*cur_frame_idx] = '\x01';
    iVar2 = gf_group->max_layer_depth;
    if (gf_group->max_layer_depth <= (int)piVar9) {
      iVar2 = (int)piVar9;
    }
    gf_group->max_layer_depth = iVar2;
    gf_group->display_idx[*cur_frame_idx] = *piVar5;
    iVar2 = av1_calc_arf_boost(twopass,twopass_frame,p_rc,(FRAME_INFO *)rc,iVar3,iVar10,0,(int *)0x0
                               ,(int *)0x0,0);
    gf_group->arf_boost[*cur_frame_idx] = iVar2;
    *piVar5 = *piVar5 + 1;
    iVar2 = *cur_frame_idx;
    if (max_parallel_frames != 0) {
      gf_group->frame_parallel_level[iVar2] = (1 < *frame_ind) + 1;
      iVar2 = *frame_ind + 1;
      if ((int)parallel_frame_count <= *frame_ind) {
        iVar2 = 1;
      }
      *frame_ind = iVar2;
      iVar2 = *cur_frame_idx;
      gf_group->is_frame_non_ref[iVar2] = true;
    }
    piVar11 = (int *)CONCAT44(in_stack_00000014,end);
    set_src_offset(gf_group,(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode),*piVar11,
                   iVar2);
    *cur_frame_idx = *cur_frame_idx + 1;
    *piVar11 = *piVar11 + 1;
    iVar10 = iVar10 + -1;
    frame_info = (FRAME_INFO *)(ulong)(iVar3 + 1);
  }
  return;
}

Assistant:

static void set_multi_layer_params_for_fp(
    const TWO_PASS *twopass, const TWO_PASS_FRAME *twopass_frame,
    GF_GROUP *const gf_group, const PRIMARY_RATE_CONTROL *p_rc,
    RATE_CONTROL *rc, FRAME_INFO *frame_info, int start, int end,
    int *cur_frame_idx, int *frame_ind, int *parallel_frame_count,
    int max_parallel_frames, int do_frame_parallel_encode,
    int *first_frame_index, int depth_thr, int *cur_disp_idx, int layer_depth) {
  const int num_frames_to_process = end - start;

  // Either we are at the last level of the pyramid, or we don't have enough
  // frames between 'l' and 'r' to create one more level.
  if (layer_depth > gf_group->max_layer_depth_allowed ||
      num_frames_to_process < 3) {
    // Leaf nodes.
    while (start < end) {
      set_params_for_leaf_frames(twopass, twopass_frame, p_rc, frame_info,
                                 gf_group, cur_frame_idx, frame_ind,
                                 parallel_frame_count, max_parallel_frames,
                                 do_frame_parallel_encode, first_frame_index,
                                 cur_disp_idx, layer_depth, start, end);
      ++start;
    }
  } else {
    const int m = (start + end - 1) / 2;

    // Internal ARF.
    int arf_src_offset = m - start;
    set_params_for_internal_arfs(
        twopass, twopass_frame, p_rc, frame_info, gf_group, cur_frame_idx,
        frame_ind, parallel_frame_count, max_parallel_frames,
        do_frame_parallel_encode, first_frame_index, INT_MAX, cur_disp_idx,
        layer_depth, arf_src_offset, m, end - m, m - start);

    // If encode reordering is enabled, configure the multi-layers accordingly
    // and return. For e.g., the encode order for gf-interval 16 after
    // reordering would be 0-> 16-> 8-> 4-> 2-> 6-> 1-> 3-> 5-> 7-> 12-> 10->
    // 14-> 9-> 11-> 13-> 15.
    if (layer_depth >= depth_thr) {
      int m1 = (m + start - 1) / 2;
      int m2 = (m + 1 + end) / 2;
      int arf_src_offsets[2] = { m1 - start, m2 - start };
      // Parameters to compute arf_boost.
      int offset[2] = { m1, m2 };
      int f_frames[2] = { m - m1, end - m2 };
      int b_frames[2] = { m1 - start, m2 - (m + 1) };

      // Set GF_GROUP params for INTNL_ARF_UPDATE frames which are reordered.
      for (int i = 0; i < 2; i++) {
        set_params_for_internal_arfs(
            twopass, twopass_frame, p_rc, frame_info, gf_group, cur_frame_idx,
            frame_ind, parallel_frame_count, max_parallel_frames,
            do_frame_parallel_encode, first_frame_index, depth_thr,
            cur_disp_idx, layer_depth + 1, arf_src_offsets[i], offset[i],
            f_frames[i], b_frames[i]);
      }

      // Initialize the start and end indices to configure LF_UPDATE frames.
      int start_idx[4] = { start, m1 + 1, m + 1, end - 1 };
      int end_idx[4] = { m1, m, m2, end };
      int layer_depth_for_intnl_overlay[4] = { layer_depth + 1, layer_depth,
                                               layer_depth + 1, INVALID_IDX };

      // Set GF_GROUP params for the rest of LF_UPDATE and INTNL_OVERLAY_UPDATE
      // frames after reordering.
      for (int i = 0; i < 4; i++) {
        set_multi_layer_params_for_fp(
            twopass, twopass_frame, gf_group, p_rc, rc, frame_info,
            start_idx[i], end_idx[i], cur_frame_idx, frame_ind,
            parallel_frame_count, max_parallel_frames, do_frame_parallel_encode,
            first_frame_index, depth_thr, cur_disp_idx, layer_depth + 2);
        if (layer_depth_for_intnl_overlay[i] != INVALID_IDX)
          set_params_for_intnl_overlay_frames(
              gf_group, cur_frame_idx, frame_ind, first_frame_index,
              cur_disp_idx, layer_depth_for_intnl_overlay[i]);
      }
      return;
    }

    // Frames displayed before this internal ARF.
    set_multi_layer_params_for_fp(
        twopass, twopass_frame, gf_group, p_rc, rc, frame_info, start, m,
        cur_frame_idx, frame_ind, parallel_frame_count, max_parallel_frames,
        do_frame_parallel_encode, first_frame_index, depth_thr, cur_disp_idx,
        layer_depth + 1);

    // Overlay for internal ARF.
    set_params_for_intnl_overlay_frames(gf_group, cur_frame_idx, frame_ind,
                                        first_frame_index, cur_disp_idx,
                                        layer_depth);

    // Frames displayed after this internal ARF.
    set_multi_layer_params_for_fp(
        twopass, twopass_frame, gf_group, p_rc, rc, frame_info, m + 1, end,
        cur_frame_idx, frame_ind, parallel_frame_count, max_parallel_frames,
        do_frame_parallel_encode, first_frame_index, depth_thr, cur_disp_idx,
        layer_depth + 1);
  }
}